

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in_memory_log_store.cxx
# Opt level: O0

void __thiscall nuraft::inmem_log_store::~inmem_log_store(inmem_log_store *this)

{
  bool bVar1;
  thread *in_RDI;
  EventAwaiter *unaff_retaddr;
  undefined1 in_stack_ffffffffffffffef;
  
  (in_RDI->_M_id)._M_thread = (native_handle_type)&PTR__inmem_log_store_00250e18;
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<std::thread,_std::default_delete<std::thread>_> *)0x15a10d);
  if (bVar1) {
    std::atomic<bool>::operator=((atomic<bool> *)in_RDI,(bool)in_stack_ffffffffffffffef);
    EventAwaiter::invoke(unaff_retaddr);
    std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::operator->
              ((unique_ptr<std::thread,_std::default_delete<std::thread>_> *)0x15a14d);
    bVar1 = std::thread::joinable(in_RDI);
    if (bVar1) {
      std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::operator->
                ((unique_ptr<std::thread,_std::default_delete<std::thread>_> *)0x15a16c);
      std::thread::join();
    }
  }
  EventAwaiter::~EventAwaiter((EventAwaiter *)0x15a18b);
  std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::~unique_ptr
            ((unique_ptr<std::thread,_std::default_delete<std::thread>_> *)in_RDI);
  std::
  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ::~map((map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
          *)0x15a1aa);
  std::
  map<unsigned_long,_std::shared_ptr<nuraft::log_entry>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>_>
  ::~map((map<unsigned_long,_std::shared_ptr<nuraft::log_entry>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>_>
          *)0x15a1b8);
  log_store::~log_store((log_store *)in_RDI);
  return;
}

Assistant:

inmem_log_store::~inmem_log_store() {
    if (disk_emul_thread_) {
        disk_emul_thread_stop_signal_ = true;
        disk_emul_ea_.invoke();
        if (disk_emul_thread_->joinable()) {
            disk_emul_thread_->join();
        }
    }
}